

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::MessageFormat::setFormat
          (MessageFormat *this,UnicodeString *formatName,Format *newFormat,UErrorCode *status)

{
  UErrorCode UVar1;
  UBool UVar2;
  int32_t argNumber;
  int32_t partIndex;
  int iVar3;
  undefined4 extraout_var;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  argNumber = MessagePattern::validateArgumentName(formatName);
  if (argNumber < -1) {
    UVar1 = U_ILLEGAL_ARGUMENT_ERROR;
LAB_00291054:
    *status = UVar1;
  }
  else {
    partIndex = 0;
    while( true ) {
      partIndex = nextTopLevelArgStart(this,partIndex);
      if ((partIndex < 0) || (U_ZERO_ERROR < *status)) break;
      UVar2 = argNameMatches(this,partIndex + 1,formatName,argNumber);
      if (UVar2 != '\0') {
        iVar3 = (*(newFormat->super_UObject)._vptr_UObject[4])(newFormat);
        if ((Format *)CONCAT44(extraout_var,iVar3) == (Format *)0x0) {
          UVar1 = U_MEMORY_ALLOCATION_ERROR;
          goto LAB_00291054;
        }
        setCustomArgStartFormat(this,partIndex,(Format *)CONCAT44(extraout_var,iVar3),status);
      }
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }